

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O0

bool device_is_ready(int device_num)

{
  int32_t iVar1;
  size_type sVar2;
  reference pvVar3;
  int in_EDI;
  DeviceTy *Device;
  size_t Devices_size;
  mutex *in_stack_fffffffffffffff0;
  bool local_1;
  
  std::mutex::lock(in_stack_fffffffffffffff0);
  sVar2 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::size(&Devices);
  std::mutex::unlock((mutex *)0x102981);
  if ((ulong)(long)in_EDI < sVar2) {
    pvVar3 = std::vector<DeviceTy,_std::allocator<DeviceTy>_>::operator[](&Devices,(long)in_EDI);
    if (((pvVar3->IsInit & 1U) == 0) &&
       (iVar1 = DeviceTy::initOnce((DeviceTy *)Devices_size), iVar1 != 0)) {
      return false;
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool device_is_ready(int device_num) {
  DP("Checking whether device %d is ready.\n", device_num);
  // Devices.size() can only change while registering a new
  // library, so try to acquire the lock of RTLs' mutex.
  RTLsMtx.lock();
  size_t Devices_size = Devices.size();
  RTLsMtx.unlock();
  if (Devices_size <= (size_t)device_num) {
    DP("Device ID  %d does not have a matching RTL\n", device_num);
    return false;
  }

  // Get device info
  DeviceTy &Device = Devices[device_num];

  DP("Is the device %d (local ID %d) initialized? %d\n", device_num,
       Device.RTLDeviceID, Device.IsInit);

  // Init the device if not done before
  if (!Device.IsInit && Device.initOnce() != OFFLOAD_SUCCESS) {
    DP("Failed to init device %d\n", device_num);
    return false;
  }

  DP("Device %d is ready to use.\n", device_num);

  return true;
}